

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitvector.h
# Opt level: O2

const_iterator * __thiscall
dg::ADT::
SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
::const_iterator::operator++(const_iterator *this)

{
  __node_type *p_Var1;
  size_t sVar2;
  
  sVar2 = this->pos + 1;
  this->pos = sVar2;
  if ((sVar2 != 0x40) && (_findClosestBit(this), this->pos != 0x40)) {
    return this;
  }
  p_Var1 = (__node_type *)
           (((this->container_it).
             super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur)
           ->super__Hash_node_base)._M_nxt;
  (this->container_it).
  super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur = p_Var1;
  this->pos = 0;
  if (p_Var1 != (this->container_end).
                super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
                _M_cur) {
    _findClosestBit(this);
  }
  return this;
}

Assistant:

const_iterator &operator++() {
            // shift to the next bit in the current bits
            assert(pos < BITS_IN_BUCKET);
            assert(container_it != container_end && "operator++ called on end");
            if (++pos != BITS_IN_BUCKET)
                _findClosestBit();

            if (pos == BITS_IN_BUCKET) {
                ++container_it;
                pos = 0;
                if (container_it != container_end) {
                    assert(container_it->second != 0 &&
                           "Empty bucket in a bitvector");
                    _findClosestBit();
                }
            }
            return *this;
        }